

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_str_kv_test.cc
# Opt level: O0

int main(void)

{
  kv_set_key_test();
  kv_get_key_test();
  kv_get_key_isnull_test();
  kv_free_test();
  kv_init_ops_test();
  kv_init_var_test();
  kv_set_var_test();
  kv_get_var_test();
  kv_ins_var();
  kv_set_str_key_test();
  kv_set_str_value_test();
  kv_get_str_data_size_test();
  kv_get_str_kv_size_test();
  kv_copy_var_test();
  kv_free_kv_var_test();
  kv_get_nth_idx_test();
  kv_cmp_key_str_test();
  kv_bid_to_value_to_bid_test();
  return 0;
}

Assistant:

int main()
{

    #ifdef _MEMPOOL
        mempool_init();
    #endif

    kv_set_key_test();
    kv_get_key_test();
    kv_get_key_isnull_test();
    kv_free_test();
    kv_init_ops_test();
    kv_init_var_test();

    kv_set_var_test();
    //kv_set_var_nentry_test();
    //kv_set_var_nentry_update_test();

    kv_get_var_test();
    //kv_get_var_nentry_test();

    kv_ins_var();
    //kv_ins_var_nentry_test();

    kv_set_str_key_test();
    kv_set_str_value_test();

    kv_get_str_data_size_test();
    kv_get_str_kv_size_test();

    kv_copy_var_test();
    //kv_copy_var_nentry_test();

    kv_free_kv_var_test();
    kv_get_nth_idx_test();
    //kv_get_nth_splitter_test();

    kv_cmp_key_str_test();

    kv_bid_to_value_to_bid_test();

    return 0;
}